

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O1

void __thiscall
gui::TextBox::TextBox(TextBox *this,shared_ptr<gui::TextBoxStyle> *style,String *name)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  Widget::Widget(&this->super_Widget,name);
  (this->super_Widget).super_Drawable._vptr_Drawable = (_func_int **)&PTR__TextBox_001e8038;
  (this->onMousePress).enabled_ = true;
  p_Var1 = &(this->onMousePress).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onMousePress).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onMousePress).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->onMousePress).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onMousePress).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onMousePress).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->onMouseRelease).enabled_ = true;
  p_Var1 = &(this->onMouseRelease).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onMouseRelease).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onMouseRelease).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->onMouseRelease).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onMouseRelease).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onMouseRelease).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->onClick).enabled_ = true;
  p_Var1 = &(this->onClick).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onClick).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onClick).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->onClick).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onClick).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onClick).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->onTextChange).enabled_ = true;
  p_Var1 = &(this->onTextChange).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onTextChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onTextChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->onTextChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onTextChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onTextChange).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->onEnterPressed).enabled_ = true;
  p_Var1 = &(this->onEnterPressed).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onEnterPressed).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onEnterPressed).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->onEnterPressed).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onEnterPressed).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onEnterPressed).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (style->super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (style->super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->styleCopied_ = false;
  (this->size_).x = 0.0;
  (this->size_).y = 0.0;
  this->widthCharacters_ = 0;
  this->maxCharacters_ = 0;
  this->readOnly_ = false;
  sf::String::String(&this->boxString_);
  sf::String::String(&this->defaultString_);
  sf::String::String(&this->visibleString_);
  this->horizontalScroll_ = 0;
  (this->caretDrawPosition_).x = 0.0;
  (this->caretDrawPosition_).y = 0.0;
  updateCaretPosition(this,0);
  return;
}

Assistant:

TextBox::TextBox(std::shared_ptr<TextBoxStyle> style, const sf::String& name) :
    baseClass(name),
    style_(style),
    styleCopied_(false),
    widthCharacters_(0),
    maxCharacters_(0),
    readOnly_(false),
    horizontalScroll_(0) {

    updateCaretPosition(0);
}